

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector4f.cpp
# Opt level: O2

Vector4f __thiscall Vector4f::homogenized(Vector4f *this)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 *in_RDI;
  ulong uVar3;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Vector4f VVar8;
  ulong uVar4;
  
  fVar1 = this->m_elements[3];
  uVar3 = (ulong)(uint)fVar1;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    auVar7 = vinsertps_avx(ZEXT416((uint)this->m_elements[0]),ZEXT416((uint)this->m_elements[1]),
                           0x10);
    auVar6._4_4_ = fVar1;
    auVar6._0_4_ = fVar1;
    auVar6._8_4_ = fVar1;
    auVar6._12_4_ = fVar1;
    auVar7 = vdivps_avx(auVar7,auVar6);
    auVar5._0_4_ = this->m_elements[2] / fVar1;
    auVar5._4_12_ = SUB6012((undefined1  [60])0x0,0);
    uVar4 = auVar5._0_8_;
    uVar3 = SUB648(ZEXT464(0x3f800000),0);
  }
  else {
    uVar4 = (ulong)(uint)this->m_elements[2];
    auVar7 = vinsertps_avx(ZEXT416((uint)this->m_elements[0]),ZEXT416((uint)this->m_elements[1]),
                           0x10);
  }
  uVar2 = vmovlps_avx(auVar7);
  *in_RDI = uVar2;
  *(int *)(in_RDI + 1) = (int)uVar4;
  *(int *)((long)in_RDI + 0xc) = (int)uVar3;
  VVar8.m_elements[2] = (float)(int)uVar4;
  VVar8.m_elements[3] = (float)(int)(uVar4 >> 0x20);
  VVar8.m_elements[0] = (float)(int)uVar3;
  VVar8.m_elements[1] = (float)(int)(uVar3 >> 0x20);
  return (Vector4f)VVar8.m_elements;
}

Assistant:

Vector4f Vector4f::homogenized() const
{
	if( m_elements[3] != 0 )
	{
		return Vector4f
			(
				m_elements[0] / m_elements[3],
				m_elements[1] / m_elements[3],
				m_elements[2] / m_elements[3],
				1
			);
	}
	else
	{
		return Vector4f
			(
				m_elements[0],
				m_elements[1],
				m_elements[2],
				m_elements[3]
			);
	}
}